

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  pointer pvVar1;
  int iVar2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__cur;
  int *piVar3;
  ostream *poVar4;
  int iVar5;
  int n;
  int x;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> m;
  int local_60;
  int local_5c;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> local_58;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105178) = 0;
  local_58.mBuckets.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.mBuckets.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.mBuckets.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.mBuckets.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x108);
  pvVar1 = local_58.mBuckets.
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 0xb;
  local_58.mBuckets.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.mBuckets.
       super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58.mBuckets.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar1;
  memset(local_58.mBuckets.
         super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start,0,0x108);
  local_58.mSize = 0;
  local_58.mMaxLoadFactor = 1.0;
  local_58.mBuckets.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  std::istream::operator>>((istream *)&std::cin,&local_60);
  if (0 < local_60) {
    iVar5 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_5c);
      iVar2 = local_5c;
      piVar3 = CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::operator[]
                         (&local_58,&local_5c);
      *piVar3 = iVar2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"max bucket length = ",0x14);
      CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::max_bucket_length(&local_58)
      ;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_60);
  }
  CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::~unordered_map(&local_58);
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  CP::unordered_map<int,int> m;
  int n;
  std::cin >> n;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    m[x] = x;
    std::cout << "max bucket length = " << m.max_bucket_length() << std::endl;
  }
}